

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebox.c
# Opt level: O0

int main(int argc,char **argv)

{
  sched_param local_24;
  int policy;
  sched_param param;
  int ctime;
  int iret1;
  char **argv_local;
  int argc_local;
  
  printf("SOEM (Simple Open EtherCAT Master)\nE/BOX test\n");
  memset(&schedp,0,4);
  schedp.sched_priority = 0x1e;
  sched_setscheduler(0,1,(sched_param *)&schedp);
  do {
    usleep(1000);
  } while (dorun != 0);
  if (argc < 2) {
    printf("Usage: ebox ifname [cycletime]\nifname = eth0 for example\ncycletime in us\n");
  }
  else {
    dorun = 1;
    if (argc < 3) {
      policy = 1000;
    }
    else {
      policy = atoi(argv[2]);
    }
    param.sched_priority = pthread_create(&thread1,(pthread_attr_t *)0x0,ecatthread,&policy);
    memset(&local_24,0,4);
    local_24.__sched_priority = 0x28;
    param.sched_priority = pthread_setschedparam(thread1,0,&local_24);
    eboxtest(argv[1]);
  }
  schedp.sched_priority = 0;
  sched_setscheduler(0,0,(sched_param *)&schedp);
  printf("End program\n");
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
   int iret1;
   int ctime;
   struct sched_param    param;
   int                   policy = SCHED_OTHER;
   
   printf("SOEM (Simple Open EtherCAT Master)\nE/BOX test\n");
   
   memset(&schedp, 0, sizeof(schedp));
   /* do not set priority above 49, otherwise sockets are starved */
   schedp.sched_priority = 30;
   sched_setscheduler(0, SCHED_FIFO, &schedp);

   do
   {
      usleep(1000);
   }
   while (dorun);
   
   if (argc > 1)
   {      
      dorun = 1;
      if( argc > 2)
         ctime = atoi(argv[2]);
      else
         ctime = 1000; // 1ms cycle time
      /* create RT thread */
      iret1 = pthread_create( &thread1, NULL, (void *) &ecatthread, (void*) &ctime);   
      memset(&param, 0, sizeof(param));
      /* give it higher priority */
      param.sched_priority = 40;
      iret1 = pthread_setschedparam(thread1, policy, &param);

      /* start acyclic part */
      eboxtest(argv[1]);
   }
   else
   {
      printf("Usage: ebox ifname [cycletime]\nifname = eth0 for example\ncycletime in us\n");
   }   
   
   schedp.sched_priority = 0;
   sched_setscheduler(0, SCHED_OTHER, &schedp);

   printf("End program\n");
   
   return (0);
}